

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Quantize_x86_avx::forward(Quantize_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int elempack;
  uint _w;
  uint _h;
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  Mat local_a8;
  Mat *local_60;
  size_t local_58;
  ulong local_50;
  size_t local_48;
  ulong local_40;
  size_t local_38;
  
  elempack = bottom_blob->elempack;
  iVar9 = bottom_blob->dims;
  _w = bottom_blob->w;
  local_50 = (ulong)_w;
  _h = bottom_blob->h;
  uVar13 = (ulong)_h;
  local_58 = (size_t)elempack;
  if (iVar9 == 3) {
    local_40 = (ulong)(uint)bottom_blob->c;
    uVar8 = elempack * bottom_blob->c;
    bVar11 = (uVar8 & 7) == 0 & opt->use_packing_layout;
    sVar2 = 8;
    if (bVar11 == 0) {
      sVar2 = 1;
    }
    Mat::create(top_blob,_w,_h,(int)uVar8 / (int)sVar2,sVar2,(int)sVar2,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    iVar9 = (int)local_50;
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    local_38 = sVar2;
    if (elempack == 4 && bVar11 == 0) {
      local_48 = CONCAT44(local_48._4_4_,_h * iVar9);
      lVar16 = 0;
      local_60 = (Mat *)0x0;
      if (0 < (int)local_40) {
        local_60 = (Mat *)(local_40 & 0xffffffff);
      }
      for (uVar13 = 0; iVar9 = (int)local_50, local_60 != (Mat *)uVar13; uVar13 = uVar13 + 1) {
        sVar2 = bottom_blob->cstep;
        sVar4 = bottom_blob->elemsize;
        sVar6 = top_blob->cstep;
        pvVar3 = top_blob->data;
        sVar7 = top_blob->elemsize;
        local_a8.data = (this->super_Quantize).scale_data.data;
        pvVar5 = bottom_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar12 = (this->super_Quantize).scale_data.refcount;
          local_a8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_a8.elempack = (this->super_Quantize).scale_data.elempack;
          local_a8.allocator = (this->super_Quantize).scale_data.allocator;
          local_a8.dims = (this->super_Quantize).scale_data.dims;
          local_a8.w = (this->super_Quantize).scale_data.w;
          local_a8.h = (this->super_Quantize).scale_data.h;
          local_a8.d = (this->super_Quantize).scale_data.d;
          local_a8.c = (this->super_Quantize).scale_data.c;
          local_a8.cstep = (this->super_Quantize).scale_data.cstep;
          local_a8.refcount = piVar12;
          if (piVar12 == (int *)0x0) goto LAB_003f992f;
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
        }
        else {
          local_a8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_a8.data = (void *)((long)local_a8.data + local_a8.elemsize * lVar16);
          local_a8.elempack = (this->super_Quantize).scale_data.elempack;
          local_a8.allocator = (this->super_Quantize).scale_data.allocator;
          local_a8.refcount = (int *)0x0;
          local_a8.dims = 1;
          local_a8.w = 4;
          local_a8.h = 1;
          local_a8.d = 1;
          local_a8.c = 1;
          local_a8.cstep = 4;
LAB_003f992f:
          piVar12 = (int *)0x0;
        }
        quantize_pack4to1((float *)(sVar2 * uVar13 * sVar4 + (long)pvVar5),
                          (char *)(sVar6 * lVar16 * sVar7 + (long)pvVar3),
                          (char *)((lVar16 + 1) * sVar6 * sVar7 + (long)pvVar3),
                          (char *)((lVar16 + 2) * sVar6 * sVar7 + (long)pvVar3),
                          (char *)((lVar16 + 3) * sVar6 * sVar7 + (long)pvVar3),&local_a8,
                          (int)local_48);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (local_a8.allocator == (Allocator *)0x0) {
              free(local_a8.data);
            }
            else {
              (*(local_a8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        lVar16 = lVar16 + 4;
      }
    }
    if (elempack != (int)local_38) {
      return 0;
    }
    uVar13 = local_40 & 0xffffffff;
    if ((int)local_40 < 1) {
      uVar13 = 0;
    }
    lVar16 = 0;
    local_60 = bottom_blob;
    for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
      sVar2 = local_60->cstep;
      sVar4 = local_60->elemsize;
      pvVar3 = local_60->data;
      sVar6 = top_blob->cstep;
      sVar7 = top_blob->elemsize;
      pvVar5 = top_blob->data;
      if ((this->super_Quantize).scale_data_size < 2) {
        piVar12 = (this->super_Quantize).scale_data.refcount;
        local_a8.data = (this->super_Quantize).scale_data.data;
        local_a8.refcount = (this->super_Quantize).scale_data.refcount;
        local_a8.elemsize = (this->super_Quantize).scale_data.elemsize;
        local_a8.elempack = (this->super_Quantize).scale_data.elempack;
        local_a8.allocator = (this->super_Quantize).scale_data.allocator;
        local_a8.dims = (this->super_Quantize).scale_data.dims;
        local_a8.w = (this->super_Quantize).scale_data.w;
        local_a8.h = (this->super_Quantize).scale_data.h;
        local_a8.d = (this->super_Quantize).scale_data.d;
        local_a8.c = (this->super_Quantize).scale_data.c;
        local_a8.cstep = (this->super_Quantize).scale_data.cstep;
        if (piVar12 == (int *)0x0) {
          piVar12 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
          piVar12 = local_a8.refcount;
        }
      }
      else {
        local_a8.elemsize = (this->super_Quantize).scale_data.elemsize;
        local_a8.data =
             (void *)(local_a8.elemsize * lVar16 + (long)(this->super_Quantize).scale_data.data);
        local_a8.elempack = (this->super_Quantize).scale_data.elempack;
        local_a8.allocator = (this->super_Quantize).scale_data.allocator;
        local_a8.refcount = (int *)0x0;
        local_a8.c = 1;
        local_a8.w = elempack;
        local_a8.dims = 1;
        local_a8.h = 1;
        local_a8.d = 1;
        local_a8.cstep = local_58;
        piVar12 = (int *)0x0;
      }
      quantize((float *)(sVar2 * uVar15 * sVar4 + (long)pvVar3),
               (char *)(sVar6 * uVar15 * sVar7 + (long)pvVar5),&local_a8,_h * iVar9,elempack);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            free(local_a8.data);
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      lVar16 = lVar16 + local_58;
    }
  }
  else if (iVar9 == 2) {
    bVar11 = (elempack * _h & 7) == 0 & opt->use_packing_layout;
    sVar2 = 8;
    if (bVar11 == 0) {
      sVar2 = 1;
    }
    Mat::create(top_blob,_w,(int)(elempack * _h) / (int)sVar2,sVar2,(int)sVar2,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    local_48 = sVar2;
    if (elempack == 4 && bVar11 == 0) {
      lVar16 = 0;
      local_60 = (Mat *)0;
      if (0 < (int)_h) {
        local_60 = (Mat *)uVar13;
      }
      for (uVar15 = 0; local_60 != (Mat *)uVar15; uVar15 = uVar15 + 1) {
        iVar9 = bottom_blob->w;
        sVar2 = bottom_blob->elemsize;
        pvVar3 = top_blob->data;
        lVar17 = (long)top_blob->w * top_blob->elemsize;
        local_a8.data = (this->super_Quantize).scale_data.data;
        pvVar5 = bottom_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar12 = (this->super_Quantize).scale_data.refcount;
          local_a8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_a8.elempack = (this->super_Quantize).scale_data.elempack;
          local_a8.allocator = (this->super_Quantize).scale_data.allocator;
          local_a8.dims = (this->super_Quantize).scale_data.dims;
          local_a8.w = (this->super_Quantize).scale_data.w;
          local_a8.h = (this->super_Quantize).scale_data.h;
          local_a8.d = (this->super_Quantize).scale_data.d;
          local_a8.c = (this->super_Quantize).scale_data.c;
          local_a8.cstep = (this->super_Quantize).scale_data.cstep;
          local_a8.refcount = piVar12;
          if (piVar12 == (int *)0x0) goto LAB_003f9795;
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
        }
        else {
          local_a8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_a8.data = (void *)((long)local_a8.data + local_a8.elemsize * lVar16);
          local_a8.elempack = (this->super_Quantize).scale_data.elempack;
          local_a8.allocator = (this->super_Quantize).scale_data.allocator;
          local_a8.refcount = (int *)0x0;
          local_a8.dims = 1;
          local_a8.w = 4;
          local_a8.h = 1;
          local_a8.d = 1;
          local_a8.c = 1;
          local_a8.cstep = 4;
LAB_003f9795:
          piVar12 = (int *)0x0;
        }
        quantize_pack4to1((float *)((long)iVar9 * uVar15 * sVar2 + (long)pvVar5),
                          (char *)(lVar17 * lVar16 + (long)pvVar3),
                          (char *)((lVar16 + 1) * lVar17 + (long)pvVar3),
                          (char *)((lVar16 + 2) * lVar17 + (long)pvVar3),
                          (char *)((lVar16 + 3) * lVar17 + (long)pvVar3),&local_a8,(int)local_50);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (local_a8.allocator == (Allocator *)0x0) {
              free(local_a8.data);
            }
            else {
              (*(local_a8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        lVar16 = lVar16 + 4;
      }
    }
    if (elempack != (int)local_48) {
      return 0;
    }
    if ((int)_h < 1) {
      uVar13 = 0;
    }
    lVar16 = 0;
    for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
      iVar9 = bottom_blob->w;
      sVar2 = bottom_blob->elemsize;
      pvVar3 = bottom_blob->data;
      iVar1 = top_blob->w;
      sVar4 = top_blob->elemsize;
      pvVar5 = top_blob->data;
      if ((this->super_Quantize).scale_data_size < 2) {
        piVar12 = (this->super_Quantize).scale_data.refcount;
        local_a8.data = (this->super_Quantize).scale_data.data;
        local_a8.refcount = (this->super_Quantize).scale_data.refcount;
        local_a8.elemsize = (this->super_Quantize).scale_data.elemsize;
        local_a8.elempack = (this->super_Quantize).scale_data.elempack;
        local_a8.allocator = (this->super_Quantize).scale_data.allocator;
        local_a8.dims = (this->super_Quantize).scale_data.dims;
        local_a8.w = (this->super_Quantize).scale_data.w;
        local_a8.h = (this->super_Quantize).scale_data.h;
        local_a8.d = (this->super_Quantize).scale_data.d;
        local_a8.c = (this->super_Quantize).scale_data.c;
        local_a8.cstep = (this->super_Quantize).scale_data.cstep;
        if (piVar12 == (int *)0x0) {
          piVar12 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
          piVar12 = local_a8.refcount;
        }
      }
      else {
        local_a8.elemsize = (this->super_Quantize).scale_data.elemsize;
        local_a8.data =
             (void *)(local_a8.elemsize * lVar16 + (long)(this->super_Quantize).scale_data.data);
        local_a8.elempack = (this->super_Quantize).scale_data.elempack;
        local_a8.allocator = (this->super_Quantize).scale_data.allocator;
        local_a8.refcount = (int *)0x0;
        local_a8.c = 1;
        local_a8.w = elempack;
        local_a8.dims = 1;
        local_a8.h = 1;
        local_a8.d = 1;
        local_a8.cstep = local_58;
        piVar12 = (int *)0x0;
      }
      quantize((float *)((long)iVar9 * uVar15 * sVar2 + (long)pvVar3),
               (char *)((long)iVar1 * uVar15 * sVar4 + (long)pvVar5),&local_a8,(int)local_50,
               elempack);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            free(local_a8.data);
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      lVar16 = lVar16 + local_58;
    }
  }
  else {
    if (iVar9 != 1) {
      return 0;
    }
    sVar2 = 8;
    if (opt->use_packing_layout == false) {
      sVar2 = 1;
    }
    if ((elempack * _w & 7) != 0) {
      sVar2 = 1;
    }
    Mat::create(top_blob,(int)(elempack * _w) / (int)sVar2,sVar2,(int)sVar2,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar13 = (long)((ulong)(uint)((int)local_50 >> 0x1f) << 0x20 | local_50 & 0xffffffff) /
             (long)opt->num_threads;
    if ((int)uVar13 < 2) {
      uVar13 = 1;
    }
    iVar9 = (int)uVar13;
    uVar15 = (long)((int)local_50 + iVar9 + -1) / (long)iVar9;
    uVar14 = uVar15 & 0xffffffff;
    if ((int)uVar15 < 1) {
      uVar14 = 0;
    }
    local_58 = local_58 * (uVar13 & 0xffffffff);
    local_48 = local_58 * 4;
    lVar17 = 0;
    lVar16 = 0;
    uVar15 = local_50;
    local_60 = bottom_blob;
    while (bVar18 = uVar14 != 0, uVar14 = uVar14 - 1, bVar18) {
      uVar10 = uVar15 & 0xffffffff;
      if (iVar9 < (int)uVar15) {
        uVar10 = uVar13 & 0xffffffff;
      }
      quantize((float *)((long)local_60->data + lVar16),(char *)((long)top_blob->data + lVar17),
               &(this->super_Quantize).scale_data,(int)uVar10 * elempack,1);
      lVar16 = lVar16 + local_48;
      lVar17 = lVar17 + local_58;
      uVar15 = (ulong)(uint)-(iVar9 - (int)uVar15);
    }
  }
  return 0;
}

Assistant:

int Quantize_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    if (dims == 1)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = w * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outw = w * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const float* ptr = (const float*)bottom_blob + i * elempack;
            signed char* s8ptr = (signed char*)top_blob + i * elempack;

            // assert scale_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            quantize(ptr, s8ptr, scale_data, size, 1);
        }
    }

    if (dims == 2)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = h * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outh = h * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 2);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 2 + 1);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_i, w);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = bottom_blob.row(i * 2);
                const float* ptr1 = bottom_blob.row(i * 2 + 1);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_i, w);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 4);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 4 + 1);
                signed char* s8ptr2 = top_blob.row<signed char>(i * 4 + 2);
                signed char* s8ptr3 = top_blob.row<signed char>(i * 4 + 3);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_i, w);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_i, w, elempack);
            }
        }
    }

    if (dims == 3)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = channels * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outc = channels * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 2);
                signed char* s8ptr1 = top_blob.channel(q * 2 + 1);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_q, w * h);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* ptr0 = bottom_blob.channel(q * 2);
                const float* ptr1 = bottom_blob.channel(q * 2 + 1);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_q, w * h);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 4);
                signed char* s8ptr1 = top_blob.channel(q * 4 + 1);
                signed char* s8ptr2 = top_blob.channel(q * 4 + 2);
                signed char* s8ptr3 = top_blob.channel(q * 4 + 3);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_q, w * h);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_q, w * h, elempack);
            }
        }
    }

    return 0;
}